

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O3

Promise<unsigned_long> __thiscall
kj::anon_unknown_123::AllReader::loop(AllReader *this,uint64_t limit)

{
  PromiseArena *pPVar1;
  OwnPromiseNode OVar2;
  PromiseArena *pPVar3;
  undefined8 *puVar4;
  void *pvVar5;
  OwnPromiseNode extraout_RAX;
  PromiseNode *extraout_RAX_00;
  _func_int **in_RDX;
  size_t newSize;
  TransformPromiseNodeBase *this_00;
  _func_int **elementCount;
  OwnPromiseNode local_a8;
  PromiseArena *local_a0;
  Array<unsigned_char> part;
  uint64_t limit_local;
  OwnPromiseNode intermediate;
  DebugComparison<unsigned_long_&,_int> _kjCondition;
  OwnPromiseNode local_38;
  
  _kjCondition.left = &limit_local;
  _kjCondition._8_8_ = _kjCondition._8_8_ & 0xffffffff00000000;
  _kjCondition.op.content.ptr = " > ";
  _kjCondition.op.content.size_ = 4;
  _kjCondition.result = in_RDX != (_func_int **)0x0;
  if (_kjCondition.result) {
    elementCount = (_func_int **)0x1000;
    if (in_RDX < (_func_int **)0x1000) {
      elementCount = in_RDX;
    }
    limit_local = (uint64_t)in_RDX;
    pPVar3 = (PromiseArena *)
             kj::_::HeapArrayDisposer::allocateImpl
                       (1,(size_t)elementCount,(size_t)elementCount,(_func_void_void_ptr *)0x0,
                        (_func_void_void_ptr *)0x0);
    part.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    puVar4 = *(undefined8 **)(limit + 0x10);
    if (puVar4 == *(undefined8 **)(limit + 0x18)) {
      newSize = 4;
      if (puVar4 != *(undefined8 **)(limit + 8)) {
        newSize = ((long)puVar4 - (long)*(undefined8 **)(limit + 8) >> 3) * 0x5555555555555556;
      }
      part.ptr = (uchar *)pPVar3;
      part.size_ = (size_t)elementCount;
      Vector<kj::Array<unsigned_char>_>::setCapacity
                ((Vector<kj::Array<unsigned_char>_> *)(limit + 8),newSize);
      puVar4 = *(undefined8 **)(limit + 0x10);
    }
    *puVar4 = pPVar3;
    puVar4[1] = elementCount;
    puVar4[2] = &kj::_::HeapArrayDisposer::instance;
    part.ptr = (uchar *)0x0;
    part.size_ = 0;
    *(undefined8 **)(limit + 0x10) = puVar4 + 3;
    (**(code **)(**(long **)limit + 8))(&local_a8,*(long **)limit,pPVar3,elementCount,elementCount);
    OVar2.ptr = local_a8.ptr;
    local_a0 = (PromiseArena *)limit_local;
    pPVar1 = ((local_a8.ptr)->super_PromiseArenaMember).arena;
    if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_a8.ptr - (long)pPVar1) < 0x40) {
      pvVar5 = operator_new(0x400);
      this_00 = (TransformPromiseNodeBase *)((long)pvVar5 + 0x3c0);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (this_00,&local_a8,
                 kj::_::
                 SimpleTransformPromiseNode<unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:188:15)>
                 ::anon_class_32_3_f55ac5fb_for_func::operator());
      *(undefined ***)((long)pvVar5 + 0x3c0) = &PTR_destroy_006de5b8;
      *(uint64_t *)((long)pvVar5 + 0x3e0) = limit;
      *(PromiseArena **)((long)pvVar5 + 1000) = pPVar3;
      *(_func_int ***)((long)pvVar5 + 0x3f0) = elementCount;
      *(PromiseArena **)((long)pvVar5 + 0x3f8) = local_a0;
      *(void **)((long)pvVar5 + 0x3c8) = pvVar5;
    }
    else {
      ((local_a8.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
      this_00 = (TransformPromiseNodeBase *)(local_a8.ptr + -4);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (this_00,&local_a8,
                 kj::_::
                 SimpleTransformPromiseNode<unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:188:15)>
                 ::anon_class_32_3_f55ac5fb_for_func::operator());
      OVar2.ptr[-4].super_PromiseArenaMember._vptr_PromiseArenaMember =
           (_func_int **)&PTR_destroy_006de5b8;
      OVar2.ptr[-2].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)limit;
      OVar2.ptr[-2].super_PromiseArenaMember.arena = pPVar3;
      OVar2.ptr[-1].super_PromiseArenaMember._vptr_PromiseArenaMember = elementCount;
      OVar2.ptr[-1].super_PromiseArenaMember.arena = local_a0;
      OVar2.ptr[-4].super_PromiseArenaMember.arena = pPVar1;
    }
    _kjCondition.left = (unsigned_long *)&DAT_004ddfe0;
    _kjCondition._8_8_ = &DAT_004de03f;
    _kjCondition.op.content.ptr = (char *)0x4c0000058b;
    intermediate.ptr = &this_00->super_PromiseNode;
    kj::_::PromiseDisposer::
    appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
              ((PromiseDisposer *)&local_38,&intermediate,(SourceLocation *)&_kjCondition);
    OVar2.ptr = intermediate.ptr;
    this->input = (AsyncInputStream *)local_38.ptr;
    if (intermediate.ptr != (PromiseNode *)0x0) {
      intermediate.ptr = (PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose(&(OVar2.ptr)->super_PromiseArenaMember);
      local_38.ptr = extraout_RAX.ptr;
    }
    OVar2.ptr = local_a8.ptr;
    if (&(local_a8.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
      local_a8.ptr = (PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose(&(OVar2.ptr)->super_PromiseArenaMember);
      local_38.ptr = extraout_RAX_00;
    }
    return (Promise<unsigned_long>)local_38.ptr;
  }
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,int>&,char_const(&)[26]>
            ((Fault *)&part,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
             ,0xb6,FAILED,"limit > 0","_kjCondition,\"Reached limit before EOF.\"",&_kjCondition,
             (char (*) [26])"Reached limit before EOF.");
  kj::_::Debug::Fault::fatal((Fault *)&part);
}

Assistant:

Promise<uint64_t> loop(uint64_t limit) {
    KJ_REQUIRE(limit > 0, "Reached limit before EOF.");

    auto part = heapArray<byte>(kj::min(4096, limit));
    auto partPtr = part.asPtr();
    parts.add(kj::mv(part));
    return input.tryRead(partPtr.begin(), partPtr.size(), partPtr.size())
        .then([this,KJ_CPCAP(partPtr),limit](size_t amount) mutable -> Promise<uint64_t> {
      limit -= amount;
      if (amount < partPtr.size()) {
        return limit;
      } else {
        return loop(limit);
      }
    });
  }